

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O3

bool __thiscall
vkt::api::anon_unknown_0::CompareEachPixelInEachRegion::forEach
          (CompareEachPixelInEachRegion *this,void *pUserData,
          vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
          *regions,int sourceWidth,int sourceHeight,PixelBufferAccess *errorMask)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  uint y;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  pointer pCVar8;
  int iVar9;
  uint x;
  VkImageBlit *blit;
  pointer pCVar10;
  undefined1 auVar11 [16];
  int iVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  bool local_88;
  Vec4 local_48;
  
  pCVar10 = (regions->
            super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar8 = (regions->
           super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar10 == pCVar8) {
    local_88 = true;
  }
  else {
    auVar11._0_4_ = (float)sourceWidth;
    auVar11._4_4_ = (float)sourceHeight;
    auVar11._8_8_ = 0;
    divps(_DAT_00aa9040,auVar11);
    local_88 = true;
    do {
      uVar3._0_4_ = ((VkOffset3D *)((long)pCVar10 + 0x38))[1].x;
      uVar3._4_4_ = ((VkOffset3D *)((long)pCVar10 + 0x38))[1].y;
      uVar1 = ((VkExtent3D *)((long)pCVar10 + 0x38))->width;
      y = ((VkExtent3D *)((long)pCVar10 + 0x38))->height;
      iVar12 = (undefined4)uVar3 - uVar1;
      iVar14 = uVar3._4_4_ - y;
      iVar6 = iVar12 >> 0x1f;
      if (0 < iVar12) {
        iVar6 = 1;
      }
      iVar9 = iVar14 >> 0x1f;
      if (0 < iVar14) {
        iVar9 = 1;
      }
      if ((int)y < uVar3._4_4_) {
        uVar2 = ((VkImageSubresourceLayers *)((long)pCVar10 + 0x1c))->aspectMask;
        uVar4 = ((VkImageSubresourceLayers *)((long)pCVar10 + 0x1c))->mipLevel;
        auVar15._0_4_ = (float)(uVar2 - (int)(pCVar10->bufferCopy).size);
        auVar15._4_4_ = (float)(uVar4 - (int)((pCVar10->bufferCopy).size >> 0x20));
        auVar15._8_8_ = 0;
        auVar13._0_4_ = (float)iVar12;
        auVar13._4_4_ = (float)iVar14;
        auVar13._8_8_ = 0;
        divps(auVar15,auVar13);
        uVar7 = uVar3 & 0xffffffff;
        do {
          x = (pCVar10->imageBlit).dstOffsets[0].x;
          if ((int)x < (int)uVar7) {
            do {
              uVar3._4_4_ = (*this->_vptr_CompareEachPixelInEachRegion[2])
                                      (this,pUserData,(ulong)x,(ulong)y);
              if ((char)uVar3._4_4_ == '\0') {
                local_48.m_data[0] = 1.0;
                local_48.m_data[1] = 0.0;
                local_48.m_data[2] = 0.0;
                local_48.m_data[3] = 1.0;
                local_88 = false;
                tcu::PixelBufferAccess::setPixel(errorMask,&local_48,x,y,0);
              }
              x = x + iVar6;
              uVar5 = (pCVar10->imageBlit).dstOffsets[1].x;
              uVar7 = (ulong)uVar5;
            } while ((int)x < (int)uVar5);
            uVar3._4_4_ = (pCVar10->imageBlit).dstOffsets[1].y;
          }
          y = y + iVar9;
        } while ((int)y < uVar3._4_4_);
        pCVar8 = (regions->
                 super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      pCVar10 = pCVar10 + 1;
    } while (pCVar10 != pCVar8);
  }
  return local_88;
}

Assistant:

bool forEach (const void*						pUserData,
				  const std::vector<CopyRegion>&	regions,
				  const int							sourceWidth,
				  const int							sourceHeight,
				  const tcu::PixelBufferAccess&		errorMask) const
	{
		bool compareOk = true;

		for (std::vector<CopyRegion>::const_iterator regionIter = regions.begin(); regionIter != regions.end(); ++regionIter)
		{
			const VkImageBlit& blit = regionIter->imageBlit;

			const int	dx		= deSign32(blit.dstOffsets[1].x - blit.dstOffsets[0].x);
			const int	dy		= deSign32(blit.dstOffsets[1].y - blit.dstOffsets[0].y);
			const float	xScale	= static_cast<float>(blit.srcOffsets[1].x - blit.srcOffsets[0].x) / static_cast<float>(blit.dstOffsets[1].x - blit.dstOffsets[0].x);
			const float	yScale	= static_cast<float>(blit.srcOffsets[1].y - blit.srcOffsets[0].y) / static_cast<float>(blit.dstOffsets[1].y - blit.dstOffsets[0].y);
			const float srcInvW	= 1.0f / static_cast<float>(sourceWidth);
			const float srcInvH	= 1.0f / static_cast<float>(sourceHeight);

			for (int y = blit.dstOffsets[0].y; y < blit.dstOffsets[1].y; y += dy)
			for (int x = blit.dstOffsets[0].x; x < blit.dstOffsets[1].x; x += dx)
			{
				const tcu::Vec2 srcNormCoord
				(
					(xScale * (static_cast<float>(x - blit.dstOffsets[0].x) + 0.5f) + static_cast<float>(blit.srcOffsets[0].x)) * srcInvW,
					(yScale * (static_cast<float>(y - blit.dstOffsets[0].y) + 0.5f) + static_cast<float>(blit.srcOffsets[0].y)) * srcInvH
				);

				if (!compare(pUserData, x, y, srcNormCoord))
				{
					errorMask.setPixel(tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y);
					compareOk = false;
				}
			}
		}
		return compareOk;
	}